

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamIndexFactory_p.cpp
# Opt level: O0

BamIndex *
BamTools::Internal::BamIndexFactory::CreateIndexOfType(IndexType *type,BamReaderPrivate *reader)

{
  BamIndex *pBVar1;
  int *in_RDI;
  BamToolsIndex *unaff_retaddr;
  BamReaderPrivate *in_stack_fffffffffffffff8;
  
  if (*in_RDI == 0) {
    pBVar1 = (BamIndex *)operator_new(0x68);
    BamToolsIndex::BamToolsIndex(unaff_retaddr,in_stack_fffffffffffffff8);
  }
  else if (*in_RDI == 1) {
    pBVar1 = (BamIndex *)operator_new(0x68);
    BamStandardIndex::BamStandardIndex((BamStandardIndex *)unaff_retaddr,in_stack_fffffffffffffff8);
  }
  else {
    pBVar1 = (BamIndex *)0x0;
  }
  return pBVar1;
}

Assistant:

BamIndex* BamIndexFactory::CreateIndexOfType(const BamIndex::IndexType& type,
                                             BamReaderPrivate* reader)
{
    switch (type) {
        case (BamIndex::STANDARD):
            return new BamStandardIndex(reader);
        case (BamIndex::BAMTOOLS):
            return new BamToolsIndex(reader);
        default:
            return 0;
    }
}